

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

QuartetSet * __thiscall
OSTEI_VRR_Algorithm_Base::PruneQuartets_
          (OSTEI_VRR_Algorithm_Base *this,QuartetSet *q,RRStepType rrstep)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  QuartetSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<Quartet>,_bool> pVar2;
  Quartet *it;
  iterator __end1;
  iterator __begin1;
  QuartetSet *__range1;
  int stepidx;
  QuartetSet qnew;
  QuartetSet *qret;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  _Rb_tree_const_iterator<Quartet> in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef8;
  set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *in_stack_ffffffffffffff00;
  byte local_f2;
  undefined1 in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff39;
  QuartetSet *in_stack_ffffffffffffff58;
  OSTEI_VRR_Algorithm_Base *in_stack_ffffffffffffff60;
  _Self local_70;
  _Self local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined1 local_51;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  PruneQuartets_(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x123775);
  local_51 = 0;
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x123787);
  local_58 = local_1c;
  local_60 = local_18;
  local_68._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_70._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = std::operator!=(&local_68,&local_70), bVar1) {
    std::_Rb_tree_const_iterator<Quartet>::operator*
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_fffffffffffffee0._M_node);
    bVar1 = Quartet::operator_cast_to_bool((Quartet *)in_stack_fffffffffffffee0._M_node);
    local_f2 = 0;
    if (bVar1) {
      Quartet::amlist((Quartet *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38));
      in_stack_ffffffffffffff00 =
           (set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
           QAM::operator[]((QAM *)in_stack_fffffffffffffee0._M_node,in_stack_fffffffffffffedc);
      local_f2 = 0 < *(int *)&(in_stack_ffffffffffffff00->_M_t)._M_impl;
      QAM::~QAM((QAM *)0x123886);
    }
    if ((local_f2 & 1) == 0) {
      pVar2 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::insert
                        (in_stack_ffffffffffffff00,
                         (value_type *)CONCAT17(local_f2,in_stack_fffffffffffffef8));
      in_stack_fffffffffffffee0 = pVar2.first._M_node;
      in_stack_fffffffffffffedc = CONCAT13(pVar2.second,(int3)in_stack_fffffffffffffedc);
    }
    else {
      pVar2 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::insert
                        (in_stack_ffffffffffffff00,
                         (value_type *)CONCAT17(local_f2,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff38 = pVar2.second;
    }
    std::_Rb_tree_const_iterator<Quartet>::operator++
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_fffffffffffffee0._M_node);
  }
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::operator=
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
             in_stack_fffffffffffffee0._M_node,
             (set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_51 = 1;
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x12398c);
  return in_RDI;
}

Assistant:

QuartetSet OSTEI_VRR_Algorithm_Base::PruneQuartets_(QuartetSet & q, RRStepType rrstep) const
{
    // this function is a mess

    // remove ssss
    PruneQuartets_(q);
 
    // now remove any where the rrstep index is 0
    QuartetSet qnew;
    QuartetSet qret;

    int stepidx = static_cast<int>(rrstep);

    for(const auto & it : q)
    {
        if(it && it.amlist()[stepidx] > 0)
            qnew.insert(it);
        else
            qret.insert(it);
    }

    q = qnew;
    return qret;
}